

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringmatcher.cpp
# Opt level: O0

void bm_init_skiptable(QStringView needle,uchar *skiptable,CaseSensitivity cs)

{
  undefined1 uVar1;
  char32_t cVar2;
  longlong *plVar3;
  uint *puVar4;
  int in_ECX;
  void *in_RDX;
  long in_FS_OFFSET;
  char16_t *start;
  int l;
  qsizetype len;
  char16_t *uc;
  char16_t *in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff90;
  long local_60;
  uint local_4c;
  storage_type_conflict *local_40;
  int local_28;
  int local_24;
  qsizetype local_20;
  QStringView local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_40 = QStringView::utf16(&local_18);
  if (in_ECX == 1) {
    local_60 = QStringView::size(&local_18);
  }
  else {
    local_20 = QStringView::size(&local_18);
    plVar3 = qMin<long_long>(&local_20,&FoldBufferCapacity);
    local_60 = *plVar3;
  }
  local_24 = (int)local_60;
  local_28 = 0xff;
  puVar4 = (uint *)qMin<int>(&local_24,&local_28);
  local_4c = *puVar4;
  memset(in_RDX,local_4c & 0xff,0x100);
  local_40 = local_40 + (local_60 - (int)local_4c);
  if (in_ECX == 1) {
    while (local_4c != 0) {
      *(char *)((long)in_RDX + (long)(int)((ushort)*local_40 & 0xff)) = (char)(local_4c - 1);
      local_40 = local_40 + 1;
      local_4c = local_4c - 1;
    }
  }
  else {
    while (local_4c != 0) {
      uVar1 = (undefined1)(local_4c - 1);
      cVar2 = foldCase((char16_t *)CONCAT17(uVar1,in_stack_ffffffffffffff90),
                       in_stack_ffffffffffffff88);
      *(undefined1 *)((long)in_RDX + (ulong)(uint)(cVar2 & 0xff)) = uVar1;
      local_4c = local_4c - 1;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void bm_init_skiptable(QStringView needle, uchar *skiptable, Qt::CaseSensitivity cs)
{
    const char16_t *uc = needle.utf16();
    const qsizetype len =
            cs == Qt::CaseSensitive ? needle.size() : qMin(needle.size(), FoldBufferCapacity);
    int l = qMin(int(len), 255);
    memset(skiptable, l, 256 * sizeof(uchar));
    uc += len - l;
    if (cs == Qt::CaseSensitive) {
        while (l--) {
            skiptable[*uc & 0xff] = l;
            ++uc;
        }
    } else {
        const char16_t *start = uc;
        while (l--) {
            skiptable[foldCase(uc, start) & 0xff] = l;
            ++uc;
        }
    }
}